

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadQuadLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  LightNodeImpl<embree::SceneGraph::QuadLight> *this_00;
  undefined8 *in_RDX;
  XMLLoader *this_01;
  string *childID;
  Vec3fa VVar1;
  Vec3fa L;
  AffineSpace3fa space;
  allocator local_111;
  undefined1 local_110 [8];
  undefined1 local_108 [36];
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  undefined1 auStack_d0 [24];
  QuadLight local_b8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  this_01 = (XMLLoader *)*in_RDX;
  std::__cxx11::string::string((string *)&local_b8,"AffineSpace",(allocator *)local_110);
  XML::child((XML *)local_108,(string *)this_01);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            ((AffineSpace3fa *)&local_58.field_1,this_01,(Ref<embree::XML> *)local_108);
  if ((XML *)local_108._0_8_ != (XML *)0x0) {
    (**(code **)(*(_func_int **)local_108._0_8_ + 0x18))();
  }
  std::__cxx11::string::~string((string *)&local_b8);
  childID = (string *)*in_RDX;
  std::__cxx11::string::string((string *)&local_b8,"L",&local_111);
  XML::child((XML *)local_110,childID);
  VVar1 = load<embree::Vec3fa>((XMLLoader *)local_108,(Ref<embree::XML> *)childID);
  if (local_110 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_110 + 0x18))(VVar1.field_0._0_4_,VVar1.field_0._8_4_);
  }
  std::__cxx11::string::~string((string *)&local_b8);
  local_28 = local_38 * 0.0 + local_28;
  fStack_24 = fStack_34 * 0.0 + fStack_24;
  fStack_20 = fStack_30 * 0.0 + fStack_20;
  fStack_1c = fStack_2c * 0.0 + fStack_1c;
  local_108._32_4_ = local_48 * 0.0 + local_28;
  fStack_e4 = fStack_44 * 0.0 + fStack_24;
  fStack_e0 = fStack_40 * 0.0 + fStack_20;
  fStack_dc = fStack_3c * 0.0 + fStack_1c;
  local_28 = local_28 + local_48;
  fStack_24 = fStack_24 + fStack_44;
  fStack_20 = fStack_20 + fStack_40;
  fStack_1c = fStack_1c + fStack_3c;
  auStack_d0._8_4_ = local_58.m128[0] + local_28;
  auStack_d0._12_4_ = local_58.m128[1] + fStack_24;
  auStack_d0._16_4_ = local_58.m128[2] + fStack_20;
  auStack_d0._20_4_ = local_58.m128[3] + fStack_1c;
  local_d8 = local_28 + local_58.m128[0] * 0.0;
  fStack_d4 = fStack_24 + local_58.m128[1] * 0.0;
  auStack_d0._0_4_ = fStack_20 + local_58.m128[2] * 0.0;
  auStack_d0._4_4_ = fStack_1c + local_58.m128[3] * 0.0;
  local_108._16_4_ = local_58.m128[0] * 0.0 + (float)local_108._32_4_;
  local_108._20_4_ = local_58.m128[1] * 0.0 + fStack_e4;
  local_108._24_4_ = local_58.m128[2] * 0.0 + fStack_e0;
  local_108._28_4_ = local_58.m128[3] * 0.0 + fStack_dc;
  local_108._32_4_ = (float)local_108._32_4_ + local_58.m128[0];
  fStack_e4 = fStack_e4 + local_58.m128[1];
  fStack_e0 = fStack_e0 + local_58.m128[2];
  fStack_dc = fStack_dc + local_58.m128[3];
  this_00 = (LightNodeImpl<embree::SceneGraph::QuadLight> *)
            SceneGraph::LightNodeImpl<embree::SceneGraph::QuadLight>::operator_new(0xd0);
  local_b8.super_Light.type = LIGHT_QUAD;
  local_b8.v0.field_0._0_8_ = CONCAT44(local_108._20_4_,local_108._16_4_);
  local_b8.v0.field_0._8_8_ = CONCAT44(local_108._28_4_,local_108._24_4_);
  local_b8.v1.field_0._0_8_ = CONCAT44(fStack_d4,local_d8);
  local_b8.v1.field_0._8_8_ = CONCAT44(auStack_d0._4_4_,auStack_d0._0_4_);
  local_b8.v2.field_0._0_8_ = CONCAT44(auStack_d0._12_4_,auStack_d0._8_4_);
  local_b8.v2.field_0._8_8_ = CONCAT44(auStack_d0._20_4_,auStack_d0._16_4_);
  local_b8.v3.field_0._0_8_ = CONCAT44(fStack_e4,local_108._32_4_);
  local_b8.v3.field_0._8_8_ = CONCAT44(fStack_dc,fStack_e0);
  local_b8.L.field_0._0_8_ = local_108._0_8_;
  local_b8.L.field_0._8_8_ = local_108._8_8_;
  SceneGraph::LightNodeImpl<embree::SceneGraph::QuadLight>::LightNodeImpl(this_00,&local_b8);
  (this->path).filename._M_dataplus._M_p = (pointer)this_00;
  (**(code **)(*(long *)&(this_00->super_LightNode).super_Node.super_RefCount + 0x10))(this_00);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadQuadLight(const Ref<XML>& xml) 
  {
    const AffineSpace3fa space = load<AffineSpace3fa>(xml->child("AffineSpace"));
    const Vec3fa L = load<Vec3fa>(xml->child("L"));
    const Vec3fa v0 = xfmPoint(space, Vec3fa(0, 0, 0));
    const Vec3fa v1 = xfmPoint(space, Vec3fa(0, 1, 0));
    const Vec3fa v2 = xfmPoint(space, Vec3fa(1, 1, 0));
    const Vec3fa v3 = xfmPoint(space, Vec3fa(1, 0, 0));
    return new SceneGraph::LightNodeImpl<SceneGraph::QuadLight>(SceneGraph::QuadLight(v0,v1,v2,v3,L));
  }